

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O3

void __thiscall CGL::Vertex::computeNormal(Vertex *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  _List_node_base *p_Var11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  (this->normal).field_0.field_0.x = 0.0;
  (this->normal).field_0.field_0.y = 0.0;
  (this->normal).field_0.field_0.z = 0.0;
  auVar13 = *(undefined1 (*) [16])(this->position).field_0.field_2.__vec;
  dVar12 = (this->position).field_0.field_0.z;
  p_Var1 = (this->_halfedge)._M_node;
  p_Var11 = p_Var1;
  do {
    if (*(char *)&p_Var11[3]._M_prev[10]._M_prev != '\0') {
      dVar15 = 0.0;
      p_Var11 = p_Var1;
      auVar10 = *(undefined1 (*) [16])(this->normal).field_0.field_2.__vec;
      do {
        p_Var2 = p_Var11[2]._M_next[2]._M_prev;
        p_Var3 = p_Var11[2]._M_next[2]._M_next[2]._M_prev;
        auVar6 = vsubpd_avx((undefined1  [16])p_Var2[2],auVar13);
        dVar8 = (double)p_Var2[3]._M_next - dVar12;
        auVar7 = vsubpd_avx((undefined1  [16])p_Var3[2],auVar13);
        dVar9 = (double)p_Var3[3]._M_next - dVar12;
        auVar4 = vshufpd_avx(auVar6,auVar6,1);
        auVar5 = vshufpd_avx(auVar7,auVar7,1);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar8 * auVar7._0_8_ - dVar9 * auVar6._0_8_;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = auVar4._0_8_ * dVar9 - auVar5._0_8_ * dVar8;
        auVar17 = vunpcklpd_avx(auVar19,auVar17);
        auVar14._0_8_ = auVar10._0_8_ + auVar17._0_8_;
        auVar14._8_8_ = auVar10._8_8_ + auVar17._8_8_;
        dVar15 = dVar15 + (auVar5._0_8_ * auVar6._0_8_ - auVar4._0_8_ * auVar7._0_8_);
        *(undefined1 (*) [16])(this->normal).field_0.field_2.__vec = auVar14;
        (this->normal).field_0.field_0.z = dVar15;
        p_Var11 = p_Var11[2]._M_next[1]._M_prev;
        auVar10 = auVar14;
      } while (p_Var11 != p_Var1);
      goto LAB_0011d031;
    }
    p_Var11 = p_Var11[1]._M_prev[2]._M_next;
  } while (p_Var11 != p_Var1);
  dVar15 = 0.0;
  p_Var11 = p_Var1;
  auVar10 = *(undefined1 (*) [16])(this->normal).field_0.field_2.__vec;
  do {
    p_Var2 = p_Var11[2]._M_next[2]._M_prev;
    p_Var3 = p_Var11[2]._M_next[2]._M_next[2]._M_prev;
    auVar6 = vsubpd_avx((undefined1  [16])p_Var2[2],auVar13);
    dVar8 = (double)p_Var2[3]._M_next - dVar12;
    auVar7 = vsubpd_avx((undefined1  [16])p_Var3[2],auVar13);
    dVar9 = (double)p_Var3[3]._M_next - dVar12;
    auVar4 = vshufpd_avx(auVar6,auVar6,1);
    auVar5 = vshufpd_avx(auVar7,auVar7,1);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar8 * auVar7._0_8_ - dVar9 * auVar6._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auVar4._0_8_ * dVar9 - auVar5._0_8_ * dVar8;
    auVar17 = vunpcklpd_avx(auVar18,auVar16);
    auVar14._0_8_ = auVar10._0_8_ + auVar17._0_8_;
    auVar14._8_8_ = auVar10._8_8_ + auVar17._8_8_;
    dVar15 = dVar15 + (auVar5._0_8_ * auVar6._0_8_ - auVar4._0_8_ * auVar7._0_8_);
    *(undefined1 (*) [16])(this->normal).field_0.field_2.__vec = auVar14;
    (this->normal).field_0.field_0.z = dVar15;
    p_Var11 = p_Var11[1]._M_prev[2]._M_next;
    auVar10 = auVar14;
  } while (p_Var11 != p_Var1);
LAB_0011d031:
  auVar13 = vdppd_avx(auVar14,auVar14,0x31);
  dVar12 = dVar15 * dVar15 + auVar13._0_8_;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar12;
    auVar13 = vsqrtsd_avx(auVar13,auVar13);
    dVar12 = auVar13._0_8_;
  }
  dVar12 = 1.0 / dVar12;
  dVar15 = (this->normal).field_0.field_0.y;
  (this->normal).field_0.field_0.x = dVar12 * (this->normal).field_0.field_0.x;
  (this->normal).field_0.field_0.y = dVar12 * dVar15;
  (this->normal).field_0.field_0.z = dVar12 * (this->normal).field_0.field_0.z;
  return;
}

Assistant:

void computeNormal(void) {
    normal = Vector3D( 0., 0., 0. );
    Vector3D pi = position;

    // Iterate over neighbors.
    HalfedgeCIter h = halfedge();
    if (isBoundary()) {
      do {
         Vector3D pj = h->next()->vertex()->position;
         Vector3D pk = h->next()->next()->vertex()->position;
         normal += cross( pj-pi, pk-pi );
         h = h->next()->twin();
      } while( h != halfedge() );      
    } else {
      do {
         Vector3D pj = h->next()->vertex()->position;
         Vector3D pk = h->next()->next()->vertex()->position;
         normal += cross( pj-pi, pk-pi );
         h = h->twin()->next();
      } while( h != halfedge() );
    }

    normal.normalize();
  }